

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_suppressor.cc
# Opt level: O1

void __thiscall
webrtc::TransientSuppressor::UpdateKeypress(TransientSuppressor *this,bool key_pressed)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000031;
  LogMessage LStack_318;
  LogMessage local_198;
  
  if ((int)CONCAT71(in_register_00000031,key_pressed) != 0) {
    this->keypress_counter_ = this->keypress_counter_ + 100;
    this->chunks_since_keypress_ = 0;
    this->detection_enabled_ = true;
  }
  iVar1 = this->keypress_counter_;
  iVar3 = 1;
  if (1 < iVar1) {
    iVar3 = iVar1;
  }
  this->keypress_counter_ = iVar3 + -1;
  if (0x65 < iVar1) {
    if (this->suppression_enabled_ == false) {
      bVar2 = LogMessage::Loggable(LS_INFO);
      if (bVar2) {
        LogMessage::LogMessage
                  (&local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_suppressor.cc"
                   ,0x12a,LS_INFO);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_198,"[ts] Transient suppression is now enabled.",0x2a);
        if (bVar2) {
          LogMessage::~LogMessage(&local_198);
        }
      }
    }
    this->suppression_enabled_ = true;
    this->keypress_counter_ = 0;
  }
  if ((this->detection_enabled_ == true) &&
     (iVar1 = this->chunks_since_keypress_, this->chunks_since_keypress_ = iVar1 + 1, 399 < iVar1))
  {
    if (this->suppression_enabled_ == true) {
      bVar2 = LogMessage::Loggable(LS_INFO);
      if (bVar2) {
        LogMessage::LogMessage
                  (&LStack_318,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_suppressor.cc"
                   ,0x133,LS_INFO);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&LStack_318,"[ts] Transient suppression is now disabled.",0x2b);
        if (bVar2) {
          LogMessage::~LogMessage(&LStack_318);
        }
      }
    }
    this->detection_enabled_ = false;
    this->suppression_enabled_ = false;
    this->keypress_counter_ = 0;
  }
  return;
}

Assistant:

void TransientSuppressor::UpdateKeypress(bool key_pressed) {
  const int kKeypressPenalty = 1000 / ts::kChunkSizeMs;
  const int kIsTypingThreshold = 1000 / ts::kChunkSizeMs;
  const int kChunksUntilNotTyping = 4000 / ts::kChunkSizeMs;  // 4 seconds.

  if (key_pressed) {
    keypress_counter_ += kKeypressPenalty;
    chunks_since_keypress_ = 0;
    detection_enabled_ = true;
  }
  keypress_counter_ = std::max(0, keypress_counter_ - 1);

  if (keypress_counter_ > kIsTypingThreshold) {
    if (!suppression_enabled_) {
      LOG(LS_INFO) << "[ts] Transient suppression is now enabled.";
    }
    suppression_enabled_ = true;
    keypress_counter_ = 0;
  }

  if (detection_enabled_ &&
      ++chunks_since_keypress_ > kChunksUntilNotTyping) {
    if (suppression_enabled_) {
      LOG(LS_INFO) << "[ts] Transient suppression is now disabled.";
    }
    detection_enabled_ = false;
    suppression_enabled_ = false;
    keypress_counter_ = 0;
  }
}